

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMath.c
# Opt level: O0

double deFractExp(double x,int *exponent)

{
  int iVar1;
  double dVar2;
  double fract;
  int *piStack_20;
  int tmpExp;
  int *exponent_local;
  double x_local;
  
  piStack_20 = exponent;
  exponent_local = (int *)x;
  iVar1 = deIsInf(x);
  if (iVar1 == 0) {
    fract._4_4_ = 0;
    dVar2 = frexp((double)exponent_local,(int *)((long)&fract + 4));
    *piStack_20 = fract._4_4_ + -1;
    x_local = dVar2 * 2.0;
  }
  else {
    *piStack_20 = 0;
    x_local = (double)exponent_local;
  }
  return x_local;
}

Assistant:

double deFractExp (double x, int* exponent)
{
	if (deIsInf(x))
	{
		*exponent = 0;
		return x;
	}
	else
	{
		int		tmpExp	= 0;
		double	fract	= frexp(x, &tmpExp);
		*exponent = tmpExp - 1;
		return fract * 2.0;
	}
}